

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_hmi_midiout.cpp
# Opt level: O2

void __thiscall HMISong::CheckCaps(HMISong *this,int tech)

{
  int iVar1;
  TrackInfo *pTVar2;
  bool bVar3;
  WORD WVar4;
  bool bVar5;
  WORD WVar6;
  WORD *pWVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  
  WVar6 = 0xa008;
  if (tech == 1) {
    WVar6 = 0xa001;
  }
  bVar10 = tech == 4;
  WVar4 = 0xa009;
  if (!bVar10) {
    WVar4 = WVar6;
  }
  iVar1 = this->NumTracks;
  pTVar2 = this->Tracks;
  pWVar7 = pTVar2->Designation;
  lVar8 = 0;
  do {
    if (iVar1 <= lVar8) {
      return;
    }
    pTVar2[lVar8].Enabled = false;
    bVar5 = false;
    lVar9 = 0;
    do {
      if ((lVar9 == 8) || (WVar6 = pWVar7[lVar9], WVar6 == 0)) break;
      if (WVar4 == WVar6) {
        pTVar2[lVar8].Enabled = true;
        break;
      }
      bVar3 = !bVar10;
      if ((WVar6 == 0xa000) || (bVar3 = bVar10, WVar6 == 0xa002)) {
        pTVar2[lVar8].Enabled = bVar3;
        bVar5 = bVar3;
      }
      lVar9 = lVar9 + 1;
    } while (bVar5 == false);
    lVar8 = lVar8 + 1;
    pWVar7 = pWVar7 + 0x1c;
  } while( true );
}

Assistant:

void HMISong::CheckCaps(int tech)
{
	// What's the equivalent HMI device for our technology?
	if (tech == MOD_FMSYNTH)
	{
		tech = HMI_DEV_OPL3;
	}
	else if (tech == MOD_MIDIPORT)
	{
		tech = HMI_DEV_MPU401;
	}
	else
	{ // Good enough? Or should we just say we're GM.
		tech = HMI_DEV_SBAWE32;
	}

	for (int i = 0; i < NumTracks; ++i)
	{
		Tracks[i].Enabled = false;
		// Track designations are stored in a 0-terminated array.
		for (unsigned int j = 0; j < countof(Tracks[i].Designation) && Tracks[i].Designation[j] != 0; ++j)
		{
			if (Tracks[i].Designation[j] == tech)
			{
				Tracks[i].Enabled = true;
			}
			// If a track is designated for device 0xA000, it will be played by a MIDI
			// driver for device types 0xA000, 0xA001, and 0xA008. Why this does not
			// include the GUS, I do not know.
			else if (Tracks[i].Designation[j] == HMI_DEV_GM)
			{
				Tracks[i].Enabled = (tech == HMI_DEV_MPU401 || tech == HMI_DEV_SBAWE32);
			}
			// If a track is designated for device 0xA002, it will be played by a MIDI
			// driver for device types 0xA002 or 0xA009.
			else if (Tracks[i].Designation[j] == HMI_DEV_OPL2)
			{
				Tracks[i].Enabled = (tech == HMI_DEV_OPL3);
			}
			// Any other designation must match the specific MIDI driver device number.
			// (Which we handled first above.)

			if (Tracks[i].Enabled)
			{ // This track's been enabled, so we can stop checking other designations.
				break;
			}
		}
	}
}